

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeTFGeometryShader::configureProgram
          (TextureCubeMapArrayTextureSizeTFGeometryShader *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  GLuint GVar5;
  NotSupportedError *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_01;
  char *local_60;
  char *fsCode;
  char *gsCode;
  char *vsCode;
  char *varyings [2];
  Functions *gl;
  TextureCubeMapArrayTextureSizeTFGeometryShader *this_local;
  long lVar7;
  
  if (((this->super_TextureCubeMapArrayTextureSizeTFBase).super_TextureCubeMapArrayTextureSizeBase.
       super_TestCaseBase.m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
               ,0x28f);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeTFBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  vsCode = "texture_std_size";
  varyings[0] = "texture_shw_size";
  (**(code **)(lVar7 + 0x14c8))
            ((this->super_TextureCubeMapArrayTextureSizeTFBase).
             super_TextureCubeMapArrayTextureSizeBase.m_po_id,2,&vsCode,0x8c8c);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Error setting transform feedback varyings.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x298);
  gsCode = getVertexShaderCode(this);
  fsCode = getGeometryShaderCode(this);
  local_60 = getFragmentShaderCode(this);
  uVar4 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  *(undefined4 *)&(this->super_TextureCubeMapArrayTextureSizeTFBase).field_0x2c4 = uVar4;
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x29f);
  GVar5 = (**(code **)(lVar7 + 0x3f0))
                    ((this->super_TextureCubeMapArrayTextureSizeTFBase).
                     super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_glExtTokens.
                     GEOMETRY_SHADER);
  this->m_gs_id = GVar5;
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x2a1);
  GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x2a3);
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,
                     (this->super_TextureCubeMapArrayTextureSizeTFBase).
                     super_TextureCubeMapArrayTextureSizeBase.m_po_id,this->m_fs_id,1,&local_60,
                     this->m_gs_id,1,&fsCode,
                     *(GLuint *)&(this->super_TextureCubeMapArrayTextureSizeTFBase).field_0x2c4,1,
                     &gsCode,(bool *)0x0);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not compile/link program object from valid shader code.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
               ,0x2a8);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeTFGeometryShader::configureProgram(void)
{
	/* Check if geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set transform feedback varyings */
	const char* varyings[] = { "texture_std_size", "texture_shw_size" };
	gl.transformFeedbackVaryings(m_po_id, m_n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting transform feedback varyings.");

	const char* vsCode = getVertexShaderCode();
	const char* gsCode = getGeometryShaderCode();
	const char* fsCode = getFragmentShaderCode();

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_gs_id, 1 /* part */, &gsCode, m_vs_id, 1 /* part */,
					  &vsCode))
	{
		TCU_FAIL("Could not compile/link program object from valid shader code.");
	}
}